

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

int secp256k1_ge_set_xquad(secp256k1_ge *r,secp256k1_fe *x)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  uint64_t uVar110;
  uint64_t uVar111;
  uint64_t uVar112;
  int iVar113;
  ulong uVar114;
  ulong uVar115;
  ulong uVar116;
  ulong uVar117;
  ulong uVar118;
  ulong uVar119;
  ulong uVar120;
  uint64_t tmp3;
  uint64_t tmp2;
  secp256k1_fe x3;
  secp256k1_fe x2;
  secp256k1_fe local_80;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  (r->x).n[4] = x->n[4];
  uVar110 = x->n[0];
  uVar111 = x->n[1];
  uVar112 = x->n[3];
  (r->x).n[2] = x->n[2];
  (r->x).n[3] = uVar112;
  (r->x).n[0] = uVar110;
  (r->x).n[1] = uVar111;
  uVar117 = x->n[0];
  uVar119 = x->n[1];
  uVar1 = x->n[2];
  uVar2 = x->n[3];
  uVar3 = x->n[4];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar117 * 2;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = uVar2;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar119 * 2;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = uVar1;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar3;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = uVar3;
  uVar114 = SUB168(auVar6 * auVar56,0);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar114 & 0xfffffffffffff;
  auVar4 = auVar5 * auVar55 + auVar4 * auVar54 + auVar7 * ZEXT816(0x1000003d10);
  uVar115 = auVar4._0_8_;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = uVar115 >> 0x34 | auVar4._8_8_ << 0xc;
  uVar3 = uVar3 * 2;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar117;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = uVar3;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar119 * 2;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = uVar2;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar1;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = uVar1;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar114 >> 0x34 | SUB168(auVar6 * auVar56,8) << 0xc;
  auVar4 = auVar8 * auVar57 + auVar96 + auVar9 * auVar58 + auVar10 * auVar59 +
           auVar11 * ZEXT816(0x1000003d10);
  uVar114 = auVar4._0_8_;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = uVar114 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar117;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = uVar117;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar119;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = uVar3;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar1 * 2;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = uVar2;
  auVar4 = auVar13 * auVar61 + auVar97 + auVar14 * auVar62;
  uVar116 = auVar4._0_8_;
  auVar99._8_8_ = 0;
  auVar99._0_8_ = uVar116 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = (uVar116 & 0xfffffffffffff) << 4 | (uVar114 & 0xfffffffffffff) >> 0x30;
  auVar4 = auVar12 * auVar60 + ZEXT816(0x1000003d1) * auVar63;
  uVar116 = auVar4._0_8_;
  local_58 = uVar116 & 0xfffffffffffff;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = uVar116 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar117 * 2;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = uVar119;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar1;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = uVar3;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar2;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = uVar2;
  auVar5 = auVar16 * auVar65 + auVar99 + auVar17 * auVar66;
  uVar116 = auVar5._0_8_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar116 & 0xfffffffffffff;
  auVar4 = auVar15 * auVar64 + auVar98 + auVar18 * ZEXT816(0x1000003d10);
  uVar118 = auVar4._0_8_;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = uVar116 >> 0x34 | auVar5._8_8_ << 0xc;
  local_50 = uVar118 & 0xfffffffffffff;
  auVar100._8_8_ = 0;
  auVar100._0_8_ = uVar118 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar117 * 2;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = uVar1;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar119;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = uVar119;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uVar2;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = uVar3;
  auVar101 = auVar21 * auVar69 + auVar101;
  uVar117 = auVar101._0_8_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar117 & 0xfffffffffffff;
  auVar4 = auVar19 * auVar67 + auVar100 + auVar20 * auVar68 + auVar22 * ZEXT816(0x1000003d10);
  uVar119 = auVar4._0_8_;
  local_48 = uVar119 & 0xfffffffffffff;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = (uVar119 >> 0x34 | auVar4._8_8_ << 0xc) + (uVar115 & 0xfffffffffffff);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar117 >> 0x34 | auVar101._8_8_ << 0xc;
  auVar102 = auVar23 * ZEXT816(0x1000003d10) + auVar102;
  uVar117 = auVar102._0_8_;
  local_40 = uVar117 & 0xfffffffffffff;
  local_38 = (uVar117 >> 0x34 | auVar102._8_8_ << 0xc) + (uVar114 & 0xffffffffffff);
  uVar117 = x->n[0];
  uVar119 = x->n[1];
  uVar1 = x->n[2];
  uVar2 = x->n[3];
  uVar3 = x->n[4];
  auVar24._8_8_ = 0;
  auVar24._0_8_ = local_58;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = uVar2;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = local_50;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = uVar1;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = local_48;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = uVar119;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = local_40;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = uVar117;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = local_38;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = uVar3;
  uVar114 = SUB168(auVar28 * auVar74,0);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar114 & 0xfffffffffffff;
  auVar4 = auVar25 * auVar71 + auVar24 * auVar70 + auVar26 * auVar72 + auVar27 * auVar73 +
           auVar29 * ZEXT816(0x1000003d10);
  uVar115 = auVar4._0_8_;
  auVar103._8_8_ = 0;
  auVar103._0_8_ = uVar115 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = local_58;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = uVar3;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = local_50;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = uVar2;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = local_48;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = uVar1;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = local_40;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = uVar119;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = local_38;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = uVar117;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = uVar114 >> 0x34 | SUB168(auVar28 * auVar74,8) << 0xc;
  auVar4 = auVar30 * auVar75 + auVar103 + auVar31 * auVar76 + auVar32 * auVar77 + auVar33 * auVar78
           + auVar34 * auVar79 + auVar35 * ZEXT816(0x1000003d10);
  uVar114 = auVar4._0_8_;
  auVar104._8_8_ = 0;
  auVar104._0_8_ = uVar114 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = local_58;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = uVar117;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = local_50;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = uVar3;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = local_48;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = uVar2;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = local_40;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = uVar1;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = local_38;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = uVar119;
  auVar4 = auVar37 * auVar81 + auVar104 + auVar38 * auVar82 + auVar39 * auVar83 + auVar40 * auVar84;
  uVar116 = auVar4._0_8_;
  auVar106._8_8_ = 0;
  auVar106._0_8_ = uVar116 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = (uVar116 & 0xfffffffffffff) << 4 | (uVar114 & 0xfffffffffffff) >> 0x30;
  auVar4 = auVar36 * auVar80 + ZEXT816(0x1000003d1) * auVar85;
  uVar118 = auVar4._0_8_;
  auVar105._8_8_ = 0;
  auVar105._0_8_ = uVar118 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = local_58;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = uVar119;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = local_50;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = uVar117;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = local_48;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = uVar3;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = local_40;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = uVar2;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = local_38;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = uVar1;
  auVar5 = auVar43 * auVar88 + auVar106 + auVar44 * auVar89 + auVar45 * auVar90;
  uVar116 = auVar5._0_8_;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = uVar116 & 0xfffffffffffff;
  auVar4 = auVar41 * auVar86 + auVar105 + auVar42 * auVar87 + auVar46 * ZEXT816(0x1000003d10);
  uVar120 = auVar4._0_8_;
  auVar108._8_8_ = 0;
  auVar108._0_8_ = uVar116 >> 0x34 | auVar5._8_8_ << 0xc;
  local_80.n[1] = uVar120 & 0xfffffffffffff;
  auVar107._8_8_ = 0;
  auVar107._0_8_ = uVar120 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = local_58;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = uVar1;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = local_50;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = uVar119;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = local_48;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = uVar117;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = local_40;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = uVar3;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = local_38;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = uVar2;
  auVar5 = auVar50 * auVar94 + auVar108 + auVar51 * auVar95;
  uVar117 = auVar5._0_8_;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = uVar117 & 0xfffffffffffff;
  auVar4 = auVar47 * auVar91 + auVar107 + auVar48 * auVar92 + auVar49 * auVar93 +
           auVar52 * ZEXT816(0x1000003d10);
  uVar119 = auVar4._0_8_;
  local_80.n[2] = uVar119 & 0xfffffffffffff;
  auVar109._8_8_ = 0;
  auVar109._0_8_ = (uVar119 >> 0x34 | auVar4._8_8_ << 0xc) + (uVar115 & 0xfffffffffffff);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = uVar117 >> 0x34 | auVar5._8_8_ << 0xc;
  auVar109 = auVar53 * ZEXT816(0x1000003d10) + auVar109;
  uVar117 = auVar109._0_8_;
  local_80.n[3] = uVar117 & 0xfffffffffffff;
  local_80.n[4] = (uVar117 >> 0x34 | auVar109._8_8_ << 0xc) + (uVar114 & 0xffffffffffff);
  r->infinity = 0;
  local_80.n[0] = (uVar118 & 0xfffffffffffff) + 7;
  iVar113 = secp256k1_fe_sqrt(&r->y,&local_80);
  return iVar113;
}

Assistant:

static int secp256k1_ge_set_xquad(secp256k1_ge *r, const secp256k1_fe *x) {
    secp256k1_fe x2, x3;
    secp256k1_fe_verify(x);
    r->x = *x;
    secp256k1_fe_sqr(&x2, x);
    secp256k1_fe_mul(&x3, x, &x2);
    r->infinity = 0;
    secp256k1_fe_add_int(&x3, SECP256K1_B);
    return secp256k1_fe_sqrt(&r->y, &x3);
}